

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssocks.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  TCPRelay *pTVar1;
  bool bVar2;
  int iVar3;
  Config *pCVar4;
  EventLoop *this;
  DNSResolve *this_00;
  UDPRelay *pUVar5;
  Log *pLVar6;
  exception *anon_var_0;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  string local_348;
  allocator local_321;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  UDPRelay *local_b8;
  UDPRelay *udp_server;
  TCPRelay *tcp_server;
  EventLoop *event_loop;
  DNSResolve *dns_resolver;
  value_type local_90;
  undefined1 local_70 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dns_servers;
  string local_50;
  byte local_2d;
  bool is_local;
  Config *local_20;
  Config *config;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  config = (Config *)argv;
  argv_local._0_4_ = argc;
  pCVar4 = (Config *)operator_new(0x30);
  Config::Config(pCVar4,(int)argv_local,(char **)config);
  local_20 = pCVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"is_local",
             (allocator *)
             ((long)&dns_servers.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size + 7));
  iVar3 = Config::GetInt(pCVar4,&local_50,0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dns_servers.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size + 7));
  local_2d = iVar3 == 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"114.114.114.114",(allocator *)((long)&dns_resolver + 7));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dns_resolver + 7));
  event_loop = (EventLoop *)0x0;
  tcp_server = (TCPRelay *)0x0;
  udp_server = (UDPRelay *)0x0;
  local_b8 = (UDPRelay *)0x0;
  this = (EventLoop *)operator_new(0x78);
  EventLoop::EventLoop(this);
  tcp_server = (TCPRelay *)this;
  this_00 = (DNSResolve *)operator_new(0x218);
  DNSResolve::DNSResolve
            (this_00,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
  event_loop = (EventLoop *)this_00;
  pUVar5 = (UDPRelay *)operator_new(0x68);
  TCPRelay::TCPRelay((TCPRelay *)pUVar5,local_20,(DNSResolve *)event_loop,(bool)(local_2d & 1));
  udp_server = pUVar5;
  pUVar5 = (UDPRelay *)operator_new(0x170);
  UDPRelay::UDPRelay(pUVar5,local_20,(DNSResolve *)event_loop,(bool)(local_2d & 1));
  local_b8 = pUVar5;
  DNSResolve::AddToLoop((DNSResolve *)event_loop,(EventLoop *)tcp_server);
  bVar2 = TCPRelay::Init((TCPRelay *)udp_server);
  if ((bVar2) && (bVar2 = UDPRelay::Init(local_b8), bVar2)) {
    if ((local_2d & 1) == 0) {
      pLVar6 = Log::GetInstance();
      pLVar6 = Log::operator<<(pLVar6,white);
      Log::FormatTime_abi_cxx11_();
      pLVar6 = Log::operator<<(pLVar6,&local_2b8);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [9])" [info] ");
      pLVar6 = Log::operator<<(pLVar6,(char (*) [8])"listen ");
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f8,"server_address",&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_320,"",&local_321);
      Config::GetStr(&local_2d8,pCVar4,&local_2f8,&local_320);
      pLVar6 = Log::operator<<(pLVar6,&local_2d8);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [2])0x168136);
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,"server_port",&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"",&local_391);
      Config::GetStr(&local_348,pCVar4,&local_368,&local_390);
      pLVar6 = Log::operator<<(pLVar6,&local_348);
      Log::operator<<(pLVar6,(char (*) [2])0x16855d);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    else {
      pLVar6 = Log::GetInstance();
      pLVar6 = Log::operator<<(pLVar6,white);
      Log::FormatTime_abi_cxx11_();
      pLVar6 = Log::operator<<(pLVar6,&local_d8);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [9])" [info] ");
      pLVar6 = Log::operator<<(pLVar6,(char (*) [8])"listen ");
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"local_address",&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,"",&local_141);
      Config::GetStr(&local_f8,pCVar4,&local_118,&local_140);
      pLVar6 = Log::operator<<(pLVar6,&local_f8);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [2])0x168136);
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"local_port",&local_189);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"",&local_1b1);
      Config::GetStr(&local_168,pCVar4,&local_188,&local_1b0);
      pLVar6 = Log::operator<<(pLVar6,&local_168);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [13])" forward to ");
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"server_address",&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,"",&local_221);
      Config::GetStr(&local_1d8,pCVar4,&local_1f8,&local_220);
      pLVar6 = Log::operator<<(pLVar6,&local_1d8);
      pLVar6 = Log::operator<<(pLVar6,(char (*) [2])0x168136);
      pCVar4 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_268,"server_port",&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,"",&local_291);
      Config::GetStr(&local_248,pCVar4,&local_268,&local_290);
      pLVar6 = Log::operator<<(pLVar6,&local_248);
      Log::operator<<(pLVar6,(char (*) [2])0x16855d);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    TCPRelay::AddToLoop((TCPRelay *)udp_server,(EventLoop *)tcp_server);
    UDPRelay::AddToLoop(local_b8,(EventLoop *)tcp_server);
    EventLoop::Run((EventLoop *)tcp_server);
  }
  pLVar6 = Log::GetInstance();
  pLVar6 = Log::operator<<(pLVar6,red);
  Log::FormatTime_abi_cxx11_();
  pLVar6 = Log::operator<<(pLVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&anon_var_0);
  pLVar6 = Log::operator<<(pLVar6,(char (*) [10])" [error] ");
  Log::operator<<(pLVar6,(char (*) [25])"error occurred, exit...\n");
  std::__cxx11::string::~string((string *)&anon_var_0);
  if (udp_server != (UDPRelay *)0x0) {
    TCPRelay::Close((TCPRelay *)udp_server);
    if (udp_server != (UDPRelay *)0x0) {
      (*(udp_server->super_ISockNotify)._vptr_ISockNotify[1])();
    }
    udp_server = (UDPRelay *)0x0;
  }
  if (local_b8 != (UDPRelay *)0x0) {
    if (local_b8 != (UDPRelay *)0x0) {
      (*(local_b8->super_ISockNotify)._vptr_ISockNotify[1])();
    }
    local_b8 = (UDPRelay *)0x0;
  }
  if (event_loop != (EventLoop *)0x0) {
    DNSResolve::Close((DNSResolve *)event_loop);
    if (event_loop != (EventLoop *)0x0) {
      (**(code **)&(event_loop->loop_impl_->sock_mode_)._M_t._M_impl)();
    }
    event_loop = (EventLoop *)0x0;
  }
  pTVar1 = tcp_server;
  if (tcp_server != (TCPRelay *)0x0) {
    if (tcp_server != (TCPRelay *)0x0) {
      EventLoop::~EventLoop((EventLoop *)tcp_server);
      operator_delete(pTVar1);
    }
    tcp_server = (TCPRelay *)0x0;
  }
  argv_local._4_4_ = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_70);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef _WIN32
    int err = 0;
    WSADATA wsaData;
    if (0 != (err = WSAStartup(MAKEWORD(2, 2), &wsaData)))
    {
        WSASetLastError(err);
        return 1;
    }
#endif
    //server --server -p 8881 -s 0.0.0.0
    //		   --server --server-port 8881 --server-address 0.0.0.0
    //client --client -p 8881 -l 1081 -s 127.0.0.1 -b 127.0.0.1
    //		   --client --server-port 8881 --server-address 127.0.0.1 --local-port 1081 --local-address 127.0.0.1
    //parse command line
    Config* config = new Config(argc, argv);
    bool is_local = config->GetInt("is_local") == 1;

    list<string> dns_servers;
    dns_servers.push_back("114.114.114.114");
    DNSResolve* dns_resolver = NULL;

    EventLoop* event_loop = NULL;
    TCPRelay* tcp_server = NULL;
    UDPRelay* udp_server = NULL;
    try
    {
        event_loop = new EventLoop();
        dns_resolver = new DNSResolve(dns_servers);
        tcp_server = new TCPRelay(config, dns_resolver, is_local);
        udp_server = new UDPRelay(config, dns_resolver, is_local);
        dns_resolver->AddToLoop(event_loop);
        if (tcp_server->Init() && udp_server->Init())
        {
            if (is_local)
                LOGI << "listen " << config->GetStr("local_address") << ":" << config->GetStr("local_port") <<
                     " forward to " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            else
                LOGI << "listen " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            tcp_server->AddToLoop(event_loop);
            udp_server->AddToLoop(event_loop);
            event_loop->Run();
        }
        LOGE << "error occurred, exit...\n";
    }
    catch (const std::exception&)
    {
        LOGE << "exception occurred, exit...\n";
    }
    if (tcp_server)
    {
        tcp_server->Close();
        delete tcp_server;
        tcp_server = NULL;
    }
    if (udp_server)
    {
        delete udp_server;
        udp_server = NULL;
    }
    if (dns_resolver)
    {
        dns_resolver->Close();
        delete dns_resolver;
        dns_resolver = NULL;
    }
    if (event_loop)
    {
        delete event_loop;
        event_loop = NULL;
    }
    return 0;
}